

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

pair<std::shared_ptr<Schedule>,_int> *
Schedule::fromFile(pair<std::shared_ptr<Schedule>,_int> *__return_storage_ptr__,string *path)

{
  size_t *psVar1;
  element_type *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pair<std::shared_ptr<Schedule>,_int> *ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  pointer this_01;
  reference this_02;
  reference json_00;
  undefined8 extraout_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int id;
  _Alloc_hider *__r;
  pointer this_03;
  TaskHandle tail;
  TaskHandle task;
  json json;
  iterator __begin1;
  iterator __end1;
  ifstream file;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  _Alloc_hider _Stack_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  _Alloc_hider local_2b0;
  undefined1 local_2a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  pair<std::shared_ptr<Schedule>,_int> *local_290;
  pointer local_288;
  pointer local_280;
  undefined1 local_278 [584];
  
  std::ifstream::ifstream((istream *)(local_278 + 0x40),(string *)path,_S_in);
  local_2a8[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  )0x0;
  local_2a0._M_allocated_capacity = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a8);
  nlohmann::operator>>
            ((istream *)(local_278 + 0x40),
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_2a8);
  this_01 = (pointer)operator_new(0x70);
  (this_01->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  (this_01->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_00142b60;
  this_01->version = 0;
  (this_01->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this_01->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01[1].operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  Common::fromJson((Common *)local_278,(json *)local_2a8);
  uVar4 = local_278._8_8_;
  uVar3 = local_278._0_8_;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (_Base_ptr)0x0;
  this = (this_01->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01->version = uVar3;
  (this_01->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar4
  ;
  if (this != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((_Base_ptr)local_278._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  local_2c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_2c0._M_p = (pointer)0x0;
  local_2a0._8_8_ = path;
  local_290 = __return_storage_ptr__;
  this_02 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_2a8,"code");
  psVar1 = &this_01->version;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)local_278,this_02);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)(local_278 + 0x20),this_02);
  local_280 = (pointer)&this_01->next_gen;
  id = 0;
  local_288 = this_01;
  while( true ) {
    bVar5 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator==((iterator *)local_278,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)(local_278 + 0x20));
    if (bVar5) break;
    json_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iterator *)local_278);
    id = id + 1;
    Task::fromJson((Task *)&local_2b8,id,
                   (vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)
                   *psVar1,json_00);
    if (local_2c8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (this_01->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_2b8;
      __r = &local_2b0;
      this_03 = local_280;
    }
    else {
      local_2c8[8]._vptr__Sp_counted_base = (_func_int **)local_2b8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8[8]._M_use_count,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b0);
      local_2b8[7]._vptr__Sp_counted_base = (_func_int **)local_2c8;
      __r = &_Stack_2c0;
      this_03 = (pointer)&local_2b8[7]._M_use_count;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_03,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r);
    local_2c8 = local_2b8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_2c0,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._M_p);
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iterator *)local_278);
  }
  local_2c8[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_2c8[8]._M_use_count;
  local_2c8[8]._M_use_count = 0;
  local_2c8[8]._M_weak_count = 0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var6 = &(local_288->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Common::recordAttributes((Common *)this_01->version,(TaskHandle *)p_Var6);
  Common::analyzePlacement((Common *)*psVar1,(TaskHandle *)p_Var6);
  bVar5 = Common::check((Common *)*psVar1,(TaskHandle *)p_Var6);
  if (bVar5) {
    Common::analyzeShare((Common *)*psVar1,(TaskHandle *)p_Var6);
    Common::refactor((TaskHandle *)p_Var6);
    ppVar2 = local_290;
    (local_290->first).super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)psVar1;
    (local_290->first).super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6 = &(this_01->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      *(int *)&p_Var6->_M_pi = *(int *)&p_Var6->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var6 = &(this_01->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      *(int *)&p_Var6->_M_pi = *(int *)&p_Var6->_M_pi + 1;
    }
    local_290->second = id;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_2c0._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_2c0._M_p);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_2a8 + 8),(value_t)local_2a8[0]);
    std::ifstream::~ifstream(local_278 + 0x40);
    return ppVar2;
  }
  error("Origin schedule in file %s check failed.",*(undefined8 *)local_2a0._8_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_2c0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_2c0._M_p);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_2a8);
  std::ifstream::~ifstream(local_278 + 0x40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static std::pair<ScheduleHandle, int> fromFile(const std::string &path) {
        // Read JSON
        std::ifstream file(path);
        nlohmann::json json;
        file >> json;

        // Operands
        auto schedule = std::make_shared<Schedule>();
        schedule->common = Common::fromJson(json);

        // Records
        int count = 0;
        TaskHandle tail;
        for (auto &item: json["code"]) {
            auto task = Task::fromJson(++ count, schedule->common->operands, item);
            if (not tail) {
                schedule->head = task;
                tail = task;
            } else {
                tail->next = task;
                task->prev = tail;
                tail = task;
            }
        }
        tail->next = nullptr;

        // Analyze common elements and refactor to the format without .dealloc and .share
        schedule->common->recordAttributes(schedule->head);
        schedule->common->analyzePlacement(schedule->head);
        if (not schedule->common->check(schedule->head)) {
            error("Origin schedule in file %s check failed.", path.c_str());
        }
        schedule->common->analyzeShare(schedule->head);
        schedule->common->refactor(schedule->head);

        return std::make_pair(schedule, count);
    }